

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t
gather(ion_bpp_handle_t handle,ion_bpp_buffer_t *pbuf,ion_bpp_key_t **pkey,ion_bpp_buffer_t **tmp)

{
  ushort *puVar1;
  void *local_50;
  ion_bpp_key_t *gkey;
  ion_bpp_buffer_t *gbuf;
  ion_bpp_err_t rc;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t **tmp_local;
  ion_bpp_key_t **pkey_local;
  ion_bpp_buffer_t *pbuf_local;
  ion_bpp_handle_t handle_local;
  
  if (*pkey == &pbuf->p->fkey +
               (int)(((*(ushort *)pbuf->p >> 1) - 1) * *(int *)((long)handle + 0xbc))) {
    *pkey = *pkey + -(long)*(int *)((long)handle + 0xbc);
  }
  handle_local._4_4_ = readDisk(handle,*(ion_bpp_address_t *)(*pkey + -8),tmp);
  if (((handle_local._4_4_ == bErrOk) &&
      (handle_local._4_4_ =
            readDisk(handle,*(ion_bpp_address_t *)(*pkey + (long)*(int *)((long)handle + 8) + 8),
                     tmp + 1), handle_local._4_4_ == bErrOk)) &&
     (handle_local._4_4_ =
           readDisk(handle,*(ion_bpp_address_t *)
                            (*pkey + (long)*(int *)((long)handle + 8) +
                                     (long)*(int *)((long)handle + 0xbc) + 8),tmp + 2),
     handle_local._4_4_ == bErrOk)) {
    local_50 = (void *)(*(long *)((long)handle + 0x98) + 0x20);
    *(ion_bpp_address_t *)(*(long *)((long)handle + 0x98) + 0x18) = (*tmp)->p->childLT;
    memcpy(local_50,&(*tmp)->p->fkey,
           (long)(int)((uint)(*(ushort *)(*tmp)->p >> 1) * *(int *)((long)handle + 0xbc)));
    local_50 = (void *)((long)local_50 +
                       (long)(int)((uint)(*(ushort *)(*tmp)->p >> 1) * *(int *)((long)handle + 0xbc)
                                  ));
    **(ushort **)((long)handle + 0x98) =
         **(ushort **)((long)handle + 0x98) & 1 | *(ushort *)(*tmp)->p & 0xfffe;
    if ((undefined1  [40])((undefined1  [40])*tmp[1]->p & (undefined1  [40])0x1) ==
        (undefined1  [40])0x0) {
      memcpy(local_50,*pkey,(long)*(int *)((long)handle + 0xbc));
      *(ion_bpp_address_t *)((long)local_50 + (long)*(int *)((long)handle + 8) + 8) =
           tmp[1]->p->childLT;
      puVar1 = *(ushort **)((long)handle + 0x98);
      *puVar1 = *puVar1 & 1 | ((*puVar1 >> 1) + 1) * 2;
      local_50 = (void *)((long)local_50 + (long)*(int *)((long)handle + 0xbc));
    }
    memcpy(local_50,&tmp[1]->p->fkey,
           (long)(int)((uint)(*(ushort *)tmp[1]->p >> 1) * *(int *)((long)handle + 0xbc)));
    local_50 = (void *)((long)local_50 +
                       (long)(int)((uint)(*(ushort *)tmp[1]->p >> 1) * *(int *)((long)handle + 0xbc)
                                  ));
    puVar1 = *(ushort **)((long)handle + 0x98);
    *puVar1 = *puVar1 & 1 | ((*puVar1 >> 1) + (*(ushort *)tmp[1]->p >> 1)) * 2;
    if ((undefined1  [40])((undefined1  [40])*tmp[2]->p & (undefined1  [40])0x1) ==
        (undefined1  [40])0x0) {
      memcpy(local_50,*pkey + *(int *)((long)handle + 0xbc),(long)*(int *)((long)handle + 0xbc));
      *(ion_bpp_address_t *)((long)local_50 + (long)*(int *)((long)handle + 8) + 8) =
           tmp[2]->p->childLT;
      puVar1 = *(ushort **)((long)handle + 0x98);
      *puVar1 = *puVar1 & 1 | ((*puVar1 >> 1) + 1) * 2;
      local_50 = (void *)((long)local_50 + (long)*(int *)((long)handle + 0xbc));
    }
    memcpy(local_50,&tmp[2]->p->fkey,
           (long)(int)((uint)(*(ushort *)tmp[2]->p >> 1) * *(int *)((long)handle + 0xbc)));
    puVar1 = *(ushort **)((long)handle + 0x98);
    *puVar1 = *puVar1 & 1 | ((*puVar1 >> 1) + (*(ushort *)tmp[2]->p >> 1)) * 2;
    **(ushort **)((long)handle + 0x98) =
         **(ushort **)((long)handle + 0x98) & 0xfffe | *(ushort *)(*tmp)->p & 1;
    handle_local._4_4_ = bErrOk;
  }
  return handle_local._4_4_;
}

Assistant:

static ion_bpp_err_t
gather(
	ion_bpp_handle_t	handle,
	ion_bpp_buffer_t	*pbuf,
	ion_bpp_key_t		**pkey,
	ion_bpp_buffer_t	**tmp
) {
	ion_bpp_h_node_t	*h = handle;
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_buffer_t	*gbuf;
	ion_bpp_key_t		*gkey;

	/*
	 * input:
	 *   pbuf				   parent buffer
	 *   pkey				   pointer to match key in parent
	 * output:
	 *   tmp					buffers to use for scatter
	 *   pkey				   pointer to match key in parent
	 * returns:
	 *   bErrOk				 operation successful
	 * notes:
	 *   Gather 3 buffers to gbuf.  Setup for subsequent scatter by
	 *   doing the following:
	 *	 - setup tmp buffer array for scattered buffers
	 *	 - adjust pkey to point to first key of 3 buffers
	*/

	/* find 3 adjacent buffers */
	if (*pkey == lkey(pbuf)) {
		*pkey -= ks(1);
	}

	if ((rc = readDisk(handle, childLT(*pkey), &tmp[0])) != 0) {
		return rc;
	}

	if ((rc = readDisk(handle, childGE(*pkey), &tmp[1])) != 0) {
		return rc;
	}

	if ((rc = readDisk(handle, childGE(*pkey + ks(1)), &tmp[2])) != 0) {
		return rc;
	}

	/* gather nodes to gbuf */
	gbuf			= &h->gbuf;
	gkey			= fkey(gbuf);

	/* tmp[0] */
	childLT(gkey)	= childLT(fkey(tmp[0]));
	memcpy(gkey, fkey(tmp[0]), ks(ct(tmp[0])));
	gkey			+= ks(ct(tmp[0]));
	ct(gbuf)		= ct(tmp[0]);

	/* tmp[1] */
	if (!leaf(tmp[1])) {
		memcpy(gkey, *pkey, ks(1));
		childGE(gkey)	= childLT(fkey(tmp[1]));
		ct(gbuf)++;
		gkey			+= ks(1);
	}

	memcpy(gkey, fkey(tmp[1]), ks(ct(tmp[1])));
	gkey		+= ks(ct(tmp[1]));
	ct(gbuf)	+= ct(tmp[1]);

	/* tmp[2] */
	if (!leaf(tmp[2])) {
		memcpy(gkey, *pkey + ks(1), ks(1));
		childGE(gkey)	= childLT(fkey(tmp[2]));
		ct(gbuf)++;
		gkey			+= ks(1);
	}

	memcpy(gkey, fkey(tmp[2]), ks(ct(tmp[2])));
	ct(gbuf)	+= ct(tmp[2]);

	leaf(gbuf)	= leaf(tmp[0]);

	return bErrOk;
}